

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFrom<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  LogMessage *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  RepeatedPtrFieldBase *local_18;
  RepeatedPtrFieldBase *other_local;
  RepeatedPtrFieldBase *this_local;
  
  local_51 = 0;
  local_18 = other;
  other_local = this;
  if (other == this) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x61d);
    local_51 = 1;
    other_00 = LogMessage::operator<<(&local_50,"CHECK failed: (&other) != (this): ");
    LogFinisher::operator=(local_65,other_00);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  if (local_18->current_size_ != 0) {
    MergeFromInternal(this,local_18,
                      (offset_in_RepeatedPtrFieldBase_to_subr)
                      MergeFromInnerLoop<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     );
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFrom(const RepeatedPtrFieldBase& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ == 0) return;
  MergeFromInternal(
      other, &RepeatedPtrFieldBase::MergeFromInnerLoop<TypeHandler>);
}